

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68020_tst_pcix_32(m68k_info *info)

{
  if ((info->type & 0x1c) != 0) {
    build_ea(info,0x174,'\x04');
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68020_tst_pcix_32(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_ea(info, M68K_INS_TST, 4);
}